

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O3

void cfd::UtxoUtil::ConvertToUtxo(UtxoData *utxo_data,Utxo *utxo,UtxoData *dest)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  Script SVar3;
  Script SVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var5;
  undefined1 auVar6 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  pointer pAVar16;
  AddressType AVar17;
  char cVar18;
  bool bVar19;
  int iVar20;
  uint64_t uVar21;
  long lVar22;
  uint16_t uVar23;
  pointer pAVar24;
  ulong uVar25;
  pointer pAVar26;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  Script *pSVar27;
  undefined8 uStack_938;
  uint32_t wit_size;
  undefined4 uStack_92c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_928;
  pointer pAStack_920;
  uint32_t txin_size;
  undefined1 auStack_914 [12];
  undefined1 in_stack_fffffffffffff6f8;
  undefined7 uStack_907;
  ByteData txid;
  ByteData block_hash;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  elements_prefixes;
  AddressFormatData local_8a8;
  void *local_868;
  code *local_850 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_7d8;
  Script local_7c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_780;
  void *local_748;
  Script local_730;
  Script local_6f8;
  Script local_6c0;
  Descriptor desc;
  UtxoData output;
  
  if (utxo == (Utxo *)0x0) {
    return;
  }
  UtxoData::UtxoData(&output,utxo_data);
  memset(utxo,0,0xd8);
  utxo->block_height = utxo_data->block_height;
  utxo->vout = utxo_data->vout;
  utxo->binary_data = utxo_data->binary_data;
  uVar21 = cfd::core::Amount::GetSatoshiValue();
  utxo->amount = uVar21;
  cfd::core::BlockHash::GetData();
  cVar18 = cfd::core::ByteData::Empty();
  if (cVar18 == '\0') {
    cfd::core::ByteData::GetBytes();
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar11 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar12 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar13 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar14 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar15 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->block_hash + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->block_hash + 0x18) = p_Var2;
    utxo->block_hash[0] = uVar8;
    utxo->block_hash[1] = uVar9;
    utxo->block_hash[2] = uVar10;
    utxo->block_hash[3] = uVar11;
    utxo->block_hash[4] = uVar12;
    utxo->block_hash[5] = uVar13;
    utxo->block_hash[6] = uVar14;
    utxo->block_hash[7] = uVar15;
    *(undefined8 *)(utxo->block_hash + 8) = uVar1;
    operator_delete(elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  cfd::core::Txid::GetData();
  cVar18 = cfd::core::ByteData::Empty();
  if (cVar18 == '\0') {
    cfd::core::ByteData::GetBytes();
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar11 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar12 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar13 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar14 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar15 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->txid + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->txid + 0x18) = p_Var2;
    utxo->txid[0] = uVar8;
    utxo->txid[1] = uVar9;
    utxo->txid[2] = uVar10;
    utxo->txid[3] = uVar11;
    utxo->txid[4] = uVar12;
    utxo->txid[5] = uVar13;
    utxo->txid[6] = uVar14;
    utxo->txid[7] = uVar15;
    *(undefined8 *)(utxo->txid + 8) = uVar1;
    operator_delete(elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((utxo_data->descriptor)._M_string_length == 0) {
    pAVar26 = (pointer)0x0;
LAB_001c54cb:
    cfd::core::Address::GetAddress_abi_cxx11_();
    pAVar24 = elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(elements_prefixes.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (pAVar24 == (pointer)0x0) {
      cVar18 = cfd::core::Script::IsEmpty();
      if (cVar18 != '\0') goto LAB_001c572f;
      cfd::core::Script::GetData();
      cfd::core::ByteData::GetBytes();
      pAVar24 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar16 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pAVar26 != (pointer)0x0) &&
         (operator_delete(pAVar26),
         elements_prefixes.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (_desc != (void *)0x0) {
        operator_delete(_desc);
      }
      cVar18 = cfd::core::Script::IsP2wpkhScript();
      if (cVar18 == '\0') {
        cVar18 = cfd::core::Script::IsP2wshScript();
        if (cVar18 == '\0') {
          cVar18 = cfd::core::Script::IsP2pkhScript();
          if (cVar18 == '\0') {
            cVar18 = cfd::core::Script::IsTaprootScript();
            if (cVar18 == '\0') {
              cVar18 = cfd::core::Script::IsWitnessProgram();
              if (cVar18 != '\0') {
                cfd::core::Script::GetElementList();
                lVar22 = cfd::core::ScriptElement::GetNumber();
                std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         *)&elements_prefixes);
                if (lVar22 != 0) {
                  output.address_type = kWitnessUnknown;
                  uVar23 = 8;
                  goto LAB_001c56f8;
                }
              }
              output.address_type = kP2shAddress;
              uVar23 = 1;
            }
            else {
              output.address_type = kTaprootAddress;
              uVar23 = 7;
            }
          }
          else {
            output.address_type = kP2pkhAddress;
            uVar23 = 2;
          }
        }
        else {
          output.address_type = kP2wshAddress;
          uVar23 = 3;
        }
      }
      else {
        output.address_type = kP2wpkhAddress;
        uVar23 = 4;
      }
LAB_001c56f8:
      utxo->address_type = uVar23;
      pAVar26 = pAVar16;
    }
    else {
      cfd::core::Address::GetLockingScript();
      cfd::core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
      core::Script::~Script((Script *)&elements_prefixes);
      cfd::core::Script::GetData();
      cfd::core::ByteData::GetBytes();
      pAVar24 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar16 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pAVar26 != (pointer)0x0) &&
         (operator_delete(pAVar26),
         elements_prefixes.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (_desc != (void *)0x0) {
        operator_delete(_desc);
      }
      if ((output._196_4_ != 1) || (1 < output.address_type - kP2shP2wshAddress)) {
        output.address_type = output._196_4_;
      }
      utxo->address_type = (uint16_t)output.address_type;
      pAVar26 = pAVar16;
    }
  }
  else {
    cfd::core::GetBitcoinAddressFormatList();
    cVar18 = cfd::core::ConfidentialAssetId::IsEmpty();
    if (cVar18 == '\0') {
      cfd::core::GetElementsAddressFormatList();
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      operator=((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)&wit_size,&elements_prefixes);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&elements_prefixes);
    }
    cfd::core::Address::GetAddress_abi_cxx11_();
    pAVar26 = elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(elements_prefixes.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (pAVar26 != (pointer)0x0) {
      p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(uStack_92c,CONCAT22(wit_size._2_2_,(uint16_t)wit_size));
      p_Var7 = local_928;
      for (this = p_Var5; local_928 != this; this = this + 1) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(this);
        p_Var7 = p_Var5;
      }
      local_928 = p_Var7;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&elements_prefixes,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&utxo_data->field_0x208);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      emplace_back<cfd::core::AddressFormatData>
                ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&wit_size,(AddressFormatData *)&elements_prefixes);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&elements_prefixes);
    }
    cfd::core::Descriptor::Parse((string *)&desc,(vector *)&utxo_data->descriptor);
    iVar20 = cfd::core::Descriptor::GetNeedArgumentNum();
    if (iVar20 == 0) {
      cfd::core::Descriptor::GetReferenceAll((vector *)&txin_size);
      cfd::core::DescriptorScriptReference::GetLockingScript();
      cfd::core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
      core::Script::~Script((Script *)&elements_prefixes);
      cfd::core::Script::GetData();
      cfd::core::ByteData::GetBytes();
      pAVar24 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pAVar26 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_748 != (void *)0x0) {
        operator_delete(local_748);
      }
      iVar20 = cfd::core::DescriptorScriptReference::GetScriptType();
      if ((iVar20 != 10) ||
         (cVar18 = cfd::core::DescriptorScriptReference::HasAddress(), cVar18 != '\0')) {
        output.address_type = cfd::core::DescriptorScriptReference::GetAddressType();
        cfd::core::DescriptorScriptReference::GenerateAddress((NetType)&elements_prefixes);
        cfd::core::Address::operator=(&output.address,(Address *)&elements_prefixes);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_780);
        core::Script::~Script(&local_7c0);
        local_850[0] = cfd::core::Psbt::CheckTxInIndex;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_7d8);
        core::TapBranch::~TapBranch((TapBranch *)local_850);
        if (local_868 != (void *)0x0) {
          operator_delete(local_868);
        }
        if ((void *)local_8a8.map_._M_t._M_impl.super__Rb_tree_header._M_node_count != (void *)0x0)
        {
          operator_delete((void *)local_8a8.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        if (local_8a8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
        {
          operator_delete(local_8a8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        }
        if (elements_prefixes.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_8a8) {
          operator_delete(elements_prefixes.
                          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        cVar18 = cfd::core::DescriptorScriptReference::HasRedeemScript();
        if (cVar18 != '\0') {
          cfd::core::DescriptorScriptReference::GetRedeemScript();
          cfd::core::Script::operator=(&output.redeem_script,(Script *)&elements_prefixes);
          core::Script::~Script((Script *)&elements_prefixes);
        }
      }
      utxo->address_type = (undefined2)output.address_type;
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                 *)&txin_size);
    }
    else {
      pAVar26 = (pointer)0x0;
      pAVar24 = (pointer)0x0;
    }
    core::DescriptorNode::~DescriptorNode((DescriptorNode *)&desc);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &wit_size);
    if (pAVar26 == pAVar24) goto LAB_001c54cb;
  }
  if (pAVar26 != pAVar24) {
    uVar25 = (long)pAVar24 - (long)pAVar26;
    utxo->script_length = (uint16_t)uVar25;
    if (((uint)uVar25 & 0xfff8) < 0x28) {
      memcpy(utxo->locking_script,pAVar26,uVar25 & 0xffff);
    }
  }
LAB_001c572f:
  wit_size._0_2_ = 0;
  wit_size._2_2_ = 0;
  txin_size = 0;
  cVar18 = cfd::core::Script::IsEmpty();
  pSVar27 = &output.scriptsig_template;
  if (cVar18 != '\0') {
    pSVar27 = (Script *)0x0;
  }
  cVar18 = cfd::core::ConfidentialAssetId::IsEmpty();
  if (cVar18 == '\0') {
    cfd::core::ConfidentialAssetId::GetData();
    cfd::core::ByteData::GetBytes();
    if (_desc != (void *)0x0) {
      operator_delete(_desc);
    }
    utxo->asset[0x20] =
         *(uint8_t *)
          &((elements_prefixes.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_right;
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar11 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar12 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar13 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar14 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar15 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->asset + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->asset + 0x18) = p_Var2;
    utxo->asset[0] = uVar8;
    utxo->asset[1] = uVar9;
    utxo->asset[2] = uVar10;
    utxo->asset[3] = uVar11;
    utxo->asset[4] = uVar12;
    utxo->asset[5] = uVar13;
    utxo->asset[6] = uVar14;
    utxo->asset[7] = uVar15;
    *(undefined8 *)(utxo->asset + 8) = uVar1;
    bVar19 = (bool)cfd::core::ConfidentialAssetId::HasBlinding();
    AVar17 = output.address_type;
    utxo->blinded = bVar19;
    cfd::core::Script::Script(&local_6c0,&output.redeem_script);
    cfd::core::Script::Script(&local_6f8);
    SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&txin_size;
    SVar3._vptr_Script = (_func_int **)&wit_size;
    SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar27;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x34;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auVar6._8_2_ = (uint16_t)wit_size;
    auVar6._0_8_ = uStack_938;
    auVar6._10_2_ = wit_size._2_2_;
    auVar6._12_4_ = uStack_92c;
    auVar6._16_8_ = local_928;
    auVar6._24_8_ = pAStack_920;
    auVar6._32_4_ = txin_size;
    auVar6._36_12_ = auStack_914;
    auVar6._48_8_ = 0;
    cfd::core::ConfidentialTxIn::EstimateTxInSize
              (AVar17,SVar3,(uint)&local_6c0,(Script)(auVar6 << 0x40),false,SUB81(&local_6f8,0),
               (uint *)0x0,(uint *)0x0,(bool)in_stack_fffffffffffff6f8,(Script *)dest,
               (int)txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
               (int)txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
               (uint *)txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
               (uint)block_hash.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    core::Script::~Script(&local_6f8);
    core::Script::~Script(&local_6c0);
    txin_size = txin_size - 0x29;
    utxo->witness_size_max = (uint16_t)wit_size;
    utxo->uscript_size_max = (uint16_t)txin_size;
    if (elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(elements_prefixes.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  AVar17 = output.address_type;
  if (txin_size == 0 && CONCAT22(wit_size._2_2_,(uint16_t)wit_size) == 0) {
    wit_size._0_2_ = 0;
    wit_size._2_2_ = 0;
    txin_size = 0;
    cfd::core::Script::Script(&local_730,&output.redeem_script);
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_2_ = (uint16_t)wit_size;
    SVar4._vptr_Script = (_func_int **)uStack_938;
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._2_2_ = wit_size._2_2_;
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = uStack_92c;
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_928;
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAStack_920;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = txin_size;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._4_12_ = auStack_914;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_fffffffffffff6f8;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = uStack_907;
    cfd::core::TxIn::EstimateTxInSize
              (AVar17,SVar4,(uint *)&local_730,&wit_size,(Script *)&txin_size);
    core::Script::~Script(&local_730);
    txin_size = txin_size - 0x29;
    utxo->witness_size_max = (uint16_t)wit_size;
    utxo->uscript_size_max = (uint16_t)txin_size;
  }
  if (dest != (UtxoData *)0x0) {
    UtxoData::operator=(dest,&output);
  }
  if (pAVar26 != (pointer)0x0) {
    operator_delete(pAVar26);
  }
  if ((void *)CONCAT44(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)txid.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(txid.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)txid.data_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
  }
  if ((void *)CONCAT44(block_hash.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       (uint)block_hash.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(block_hash.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint)block_hash.data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
  }
  UtxoData::~UtxoData(&output);
  return;
}

Assistant:

void UtxoUtil::ConvertToUtxo(
    const UtxoData& utxo_data, Utxo* utxo, UtxoData* dest) {
  if (utxo != nullptr) {
    UtxoData output(utxo_data);
    memset(utxo, 0, sizeof(Utxo));
    utxo->block_height = utxo_data.block_height;
    utxo->vout = utxo_data.vout;
    utxo->binary_data = utxo_data.binary_data;
    utxo->amount = utxo_data.amount.GetSatoshiValue();

    ByteData block_hash = utxo_data.block_hash.GetData();
    if (!block_hash.Empty()) {
      memcpy(
          utxo->block_hash, block_hash.GetBytes().data(),
          sizeof(utxo->block_hash));
    }
    ByteData txid = utxo_data.txid.GetData();
    if (!txid.Empty()) {
      memcpy(utxo->txid, txid.GetBytes().data(), sizeof(utxo->txid));
    }

    // convert from descriptor
    std::vector<uint8_t> locking_script_bytes;
    if (!utxo_data.descriptor.empty()) {
      NetType net_type = NetType::kMainnet;
      std::vector<AddressFormatData> addr_prefixes =
          cfd::core::GetBitcoinAddressFormatList();
#ifndef CFD_DISABLE_ELEMENTS
      if (!utxo_data.asset.IsEmpty()) {
        std::vector<AddressFormatData> elements_prefixes =
            cfd::core::GetElementsAddressFormatList();
        addr_prefixes = elements_prefixes;
        net_type = NetType::kLiquidV1;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (!utxo_data.address.GetAddress().empty()) {
        addr_prefixes.clear();
        addr_prefixes.push_back(utxo_data.address.GetAddressFormatData());
        net_type = utxo_data.address.GetNetType();
      }

      Descriptor desc =
          Descriptor::Parse(utxo_data.descriptor, &addr_prefixes);
      if (desc.GetNeedArgumentNum() == 0) {
        std::vector<DescriptorScriptReference> ref_list =
            desc.GetReferenceAll();
        DescriptorScriptReference& script_ref = ref_list[0];
        output.locking_script = script_ref.GetLockingScript();
        locking_script_bytes = output.locking_script.GetData().GetBytes();
        if ((script_ref.GetScriptType() !=
             DescriptorScriptType::kDescriptorScriptRaw) ||
            script_ref.HasAddress()) {
          output.address_type = script_ref.GetAddressType();
          output.address = script_ref.GenerateAddress(net_type);
          if (ref_list[ref_list.size() - 1].HasRedeemScript()) {
            output.redeem_script =
                ref_list[ref_list.size() - 1].GetRedeemScript();
          }
        }
        utxo->address_type = static_cast<uint16_t>(output.address_type);
      }
    }

    if (!locking_script_bytes.empty()) {
      // do nothing
    } else if (!output.address.GetAddress().empty()) {
      output.locking_script = output.address.GetLockingScript();
      locking_script_bytes = output.locking_script.GetData().GetBytes();
      AddressType addr_type = output.address.GetAddressType();
      if ((addr_type == AddressType::kP2shAddress) &&
          ((output.address_type == AddressType::kP2shP2wshAddress) ||
           (output.address_type == AddressType::kP2shP2wpkhAddress))) {
        // direct set. output.address_type;
      } else {
        output.address_type = addr_type;
      }
      utxo->address_type = static_cast<uint16_t>(output.address_type);
    } else if (!utxo_data.locking_script.IsEmpty()) {
      locking_script_bytes = utxo_data.locking_script.GetData().GetBytes();
      if (utxo_data.locking_script.IsP2wpkhScript()) {
        utxo->address_type = AddressType::kP2wpkhAddress;
      } else if (utxo_data.locking_script.IsP2wshScript()) {
        utxo->address_type = AddressType::kP2wshAddress;
      } else if (utxo_data.locking_script.IsP2pkhScript()) {
        utxo->address_type = AddressType::kP2pkhAddress;
      } else if (utxo_data.locking_script.IsTaprootScript()) {
        utxo->address_type = AddressType::kTaprootAddress;
      } else if (
          utxo_data.locking_script.IsWitnessProgram() &&
          (utxo_data.locking_script.GetElementList()[0].GetNumber() != 0)) {
        utxo->address_type = AddressType::kWitnessUnknown;
      } else {  // TODO(k-matsuzawa): unbknown type is convert to p2sh
        utxo->address_type = AddressType::kP2shAddress;
      }
      output.address_type = static_cast<AddressType>(utxo->address_type);
    }

    if (!locking_script_bytes.empty()) {
      utxo->script_length = static_cast<uint16_t>(locking_script_bytes.size());
      if (utxo->script_length < sizeof(utxo->locking_script)) {
        memcpy(
            utxo->locking_script, locking_script_bytes.data(),
            utxo->script_length);
      }
    }

    uint32_t wit_size = 0;
    uint32_t txin_size = 0;
    const Script* scriptsig_template = nullptr;
    if (!output.scriptsig_template.IsEmpty()) {
      scriptsig_template = &output.scriptsig_template;
    }

#ifndef CFD_DISABLE_ELEMENTS
    if (!utxo_data.asset.IsEmpty()) {
      std::vector<uint8_t> asset = utxo_data.asset.GetData().GetBytes();
      memcpy(utxo->asset, asset.data(), sizeof(utxo->asset));
      utxo->blinded = utxo_data.asset.HasBlinding();

      ConfidentialTxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, 0, Script(), false, false,
          &wit_size, &txin_size, false, scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }
#endif  // CFD_DISABLE_ELEMENTS

    if ((wit_size == 0) && (txin_size == 0)) {
      wit_size = 0;
      txin_size = 0;
      TxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, &wit_size, &txin_size,
          scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }

    if (dest != nullptr) {
      *dest = output;
    }
  }
}